

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void x25519_scalar_mult_adx(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  byte bVar1;
  int local_130;
  uint b;
  int pos;
  uint swap;
  fe4 tmp1;
  fe4 tmp0;
  fe4 z3;
  fe4 x3;
  fe4 z2;
  fe4 x2;
  fe4 x1;
  uint8_t e [32];
  uint8_t *point_local;
  uint8_t *scalar_local;
  uint8_t *out_local;
  
  OPENSSL_memcpy(x1 + 3,scalar,0x20);
  x1[3]._0_1_ = (byte)x1[3] & 0xf8;
  z2[3] = 1;
  x2[0] = 0;
  x2[1] = 0;
  x2[2] = 0;
  memset(x3 + 3,0,0x20);
  tmp0[3] = 1;
  z3[0] = 0;
  z3[1] = 0;
  z3[2] = 0;
  OPENSSL_memcpy(x2 + 3,point,0x20);
  x1[2] = x1[2] & 0x7fffffffffffffff;
  OPENSSL_memcpy(z3 + 3,x2 + 3,0x20);
  b = 0;
  for (local_130 = 0xfe; bVar1 = (byte)b, -1 < local_130; local_130 = local_130 + -1) {
    b = (int)(uint)*(byte *)((long)x1 + (long)(local_130 / 8) + 0x18) >> ((byte)local_130 & 7) & 1;
    bVar1 = (byte)b ^ bVar1;
    fe4_cswap(z2 + 3,z3 + 3,bVar1,z2 + 3,z3 + 3);
    fe4_cswap(x3 + 3,tmp0 + 3,bVar1,x3 + 3,tmp0 + 3);
    fe4_sub(tmp1 + 3,z3 + 3,tmp0 + 3);
    fe4_sub((uint64_t *)&pos,z2 + 3,x3 + 3);
    fe4_add(z2 + 3,z2 + 3,x3 + 3);
    fe4_add(x3 + 3,z3 + 3,tmp0 + 3);
    fe4_mul(tmp0 + 3,tmp1 + 3,z2 + 3);
    fe4_mul(x3 + 3,x3 + 3,(uint64_t *)&pos);
    fe4_sq(tmp1 + 3,(uint64_t *)&pos);
    fe4_sq((uint64_t *)&pos,z2 + 3);
    fe4_add(z3 + 3,tmp0 + 3,x3 + 3);
    fe4_sub(x3 + 3,tmp0 + 3,x3 + 3);
    fe4_mul(z2 + 3,(uint64_t *)&pos,tmp1 + 3);
    fe4_sub((uint64_t *)&pos,(uint64_t *)&pos,tmp1 + 3);
    fe4_sq(x3 + 3,x3 + 3);
    fe4_scmul(tmp0 + 3,(uint64_t *)&pos,0x1db42);
    fe4_sq(z3 + 3,z3 + 3);
    fe4_add(tmp1 + 3,tmp1 + 3,tmp0 + 3);
    fe4_mul(tmp0 + 3,x2 + 3,x3 + 3);
    fe4_mul(x3 + 3,(uint64_t *)&pos,tmp1 + 3);
  }
  fe4_cswap(z2 + 3,z3 + 3,bVar1,z2 + 3,z3 + 3);
  fe4_cswap(x3 + 3,tmp0 + 3,bVar1,x3 + 3,tmp0 + 3);
  fe4_invert(x3 + 3,x3 + 3);
  fe4_mul(z2 + 3,z2 + 3,x3 + 3);
  fe4_canon(z2 + 3,z2 + 3);
  OPENSSL_memcpy(out,z2 + 3,0x20);
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
void x25519_scalar_mult_adx(uint8_t out[32], const uint8_t scalar[32],
                            const uint8_t point[32]) {
  uint8_t e[32];
  OPENSSL_memcpy(e, scalar, 32);
  e[0] &= 248;
  e[31] &= 127;
  e[31] |= 64;

  // The following implementation was transcribed to Coq and proven to
  // correspond to unary scalar multiplication in affine coordinates given that
  // x1 != 0 is the x coordinate of some point on the curve. It was also checked
  // in Coq that doing a ladderstep with x1 = x3 = 0 gives z2' = z3' = 0, and z2
  // = z3 = 0 gives z2' = z3' = 0. The statement was quantified over the
  // underlying field, so it applies to Curve25519 itself and the quadratic
  // twist of Curve25519. It was not proven in Coq that prime-field arithmetic
  // correctly simulates extension-field arithmetic on prime-field values.
  // The decoding of the byte array representation of e was not considered.
  // Specification of Montgomery curves in affine coordinates:
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Spec/MontgomeryCurve.v#L27>
  // Proof that these form a group that is isomorphic to a Weierstrass curve:
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/AffineProofs.v#L35>
  // Coq transcription and correctness proof of the loop (where scalarbits=255):
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZ.v#L118>
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L278>
  // preconditions: 0 <= e < 2^255 (not necessarily e < order), fe_invert(0) = 0
  fe4 x1, x2 = {1}, z2 = {0}, x3, z3 = {1}, tmp0, tmp1;
  OPENSSL_memcpy(x1, point, sizeof(fe4));
  x1[3] &= (uint64_t)(-1)>>1;
  OPENSSL_memcpy(x3, x1, sizeof(fe4));

  unsigned swap = 0;
  int pos;
  for (pos = 254; pos >= 0; --pos) {
    // loop invariant as of right before the test, for the case where x1 != 0:
    //   pos >= -1; if z2 = 0 then x2 is nonzero; if z3 = 0 then x3 is nonzero
    //   let r := e >> (pos+1) in the following equalities of projective points:
    //   to_xz (r*P)     === if swap then (x3, z3) else (x2, z2)
    //   to_xz ((r+1)*P) === if swap then (x2, z2) else (x3, z3)
    //   x1 is the nonzero x coordinate of the nonzero point (r*P-(r+1)*P)
    unsigned b = 1 & (e[pos / 8] >> (pos & 7));
    swap ^= b;
    fe4_cswap(x2, x3, swap, x2, x3);
    fe4_cswap(z2, z3, swap, z2, z3);
    swap = b;
    // Coq transcription of ladderstep formula (called from transcribed loop):
    // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZ.v#L89>
    // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L131>
    // x1 != 0 <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L217>
    // x1  = 0 <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L147>
    fe4_sub(tmp0, x3, z3);
    fe4_sub(tmp1, x2, z2);
    fe4_add(x2, x2, z2);
    fe4_add(z2, x3, z3);
    fe4_mul(z3, tmp0, x2);
    fe4_mul(z2, z2, tmp1);
    fe4_sq(tmp0, tmp1);
    fe4_sq(tmp1, x2);
    fe4_add(x3, z3, z2);
    fe4_sub(z2, z3, z2);
    fe4_mul(x2, tmp1, tmp0);
    fe4_sub(tmp1, tmp1, tmp0);
    fe4_sq(z2, z2);
    fe4_scmul(z3, tmp1, 121666);
    fe4_sq(x3, x3);
    fe4_add(tmp0, tmp0, z3);
    fe4_mul(z3, x1, z2);
    fe4_mul(z2, tmp1, tmp0);
  }
  // here pos=-1, so r=e, so to_xz (e*P) === if swap then (x3, z3) else (x2, z2)
  fe4_cswap(x2, x3, swap, x2, x3);
  fe4_cswap(z2, z3, swap, z2, z3);

  fe4_invert(z2, z2);
  fe4_mul(x2, x2, z2);
  fe4_canon(x2, x2);
  OPENSSL_memcpy(out, x2, sizeof(fe4));
}